

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O3

int Lpk_NodeCutsCheckDsd(Lpk_Man_t *p,Lpk_Cut_t *pCut)

{
  uint *puVar1;
  int *__s;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void *pvVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  
  if ((*(uint *)pCut & 0x3f) == 0) {
    __assert_fail("pCut->nLeaves > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                  ,0x117,"int Lpk_NodeCutsCheckDsd(Lpk_Man_t *, Lpk_Cut_t *)");
  }
  __s = p->pRefs;
  iVar12 = 0;
  memset(__s,0,(ulong)((*(uint *)pCut & 0x3f) << 2));
  uVar9 = *(uint *)pCut;
  if ((uVar9 & 0x3f) != 0) {
    uVar11 = 0;
    do {
      iVar2 = pCut->pLeaves[uVar11];
      if (((long)iVar2 < 0) || (pVVar3 = p->pNtk->vObjs, pVVar3->nSize <= iVar2)) goto LAB_004eb642;
      pvVar4 = pVVar3->pArray[iVar2];
      if ((*(uint *)((long)pvVar4 + 0x14) & 0x10) != 0) {
        __assert_fail("pObj->fMarkA == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                      ,0x11d,"int Lpk_NodeCutsCheckDsd(Lpk_Man_t *, Lpk_Cut_t *)");
      }
      *(uint *)((long)pvVar4 + 0x14) = *(uint *)((long)pvVar4 + 0x14) | 0x10;
      *(ulong *)((long)pvVar4 + 0x40) = uVar11;
      uVar11 = uVar11 + 1;
      uVar9 = *(uint *)pCut;
    } while (uVar11 < (uVar9 & 0x3f));
  }
  if ((uVar9 & 0xfc0) != 0) {
    pVVar3 = p->pNtk->vObjs;
    uVar11 = 0;
    uVar10 = 0;
    do {
      iVar12 = pCut->pNodes[uVar11];
      if (((long)iVar12 < 0) || (pVVar3->nSize <= iVar12)) goto LAB_004eb642;
      plVar5 = (long *)pVVar3->pArray[iVar12];
      uVar13 = (ulong)*(uint *)((long)plVar5 + 0x1c);
      if ((int)*(uint *)((long)plVar5 + 0x1c) < 1) {
LAB_004eb543:
        lVar14 = (long)(int)uVar10;
        uVar10 = uVar10 + 1;
        p->pCands[lVar14] = (int)plVar5[2];
      }
      else {
        lVar6 = plVar5[4];
        lVar7 = *(long *)(*(long *)(*plVar5 + 0x20) + 8);
        bVar8 = true;
        lVar14 = 0;
        do {
          lVar16 = *(long *)(lVar7 + (long)*(int *)(lVar6 + lVar14 * 4) * 8);
          if ((*(byte *)(lVar16 + 0x14) & 0x10) == 0) {
            lVar15 = lVar14;
            do {
              lVar14 = lVar15 + 1;
              if ((int)uVar13 <= lVar14) goto LAB_004eb553;
              lVar16 = *(long *)(lVar7 + (long)*(int *)(lVar6 + 4 + lVar15 * 4) * 8);
              lVar15 = lVar14;
            } while ((*(byte *)(lVar16 + 0x14) & 0x10) == 0);
            bVar8 = false;
          }
          __s[*(int *)(lVar16 + 0x40)] = __s[*(int *)(lVar16 + 0x40)] + 1;
          uVar13 = (ulong)*(int *)((long)plVar5 + 0x1c);
          lVar14 = lVar14 + 1;
        } while (lVar14 < (long)uVar13);
        if (bVar8) goto LAB_004eb543;
      }
LAB_004eb553:
      uVar11 = uVar11 + 1;
      uVar9 = *(uint *)pCut;
    } while (uVar11 < (uVar9 >> 6 & 0x3f));
    if (0 < (int)uVar10) {
      pVVar3 = p->pNtk->vObjs;
      uVar11 = 0;
      do {
        iVar12 = p->pCands[uVar11];
        if (((long)iVar12 < 0) || (pVVar3->nSize <= iVar12)) goto LAB_004eb642;
        plVar5 = (long *)pVVar3->pArray[iVar12];
        iVar12 = *(int *)((long)plVar5 + 0x1c);
        if ((long)iVar12 < 1) {
          lVar14 = 0;
        }
        else {
          lVar14 = 0;
          while( true ) {
            lVar6 = *(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                             (long)*(int *)(plVar5[4] + lVar14 * 4) * 8);
            if ((*(byte *)(lVar6 + 0x14) & 0x10) == 0) {
              __assert_fail("pFanin->fMarkA == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                            ,0x135,"int Lpk_NodeCutsCheckDsd(Lpk_Man_t *, Lpk_Cut_t *)");
            }
            if (1 < __s[*(int *)(lVar6 + 0x40)]) break;
            lVar14 = lVar14 + 1;
            if (iVar12 == lVar14) goto LAB_004eb5f6;
          }
        }
        if ((int)lVar14 == iVar12) {
LAB_004eb5f6:
          iVar12 = 1;
          goto LAB_004eb5fb;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar10);
    }
    iVar12 = 0;
  }
LAB_004eb5fb:
  if ((uVar9 & 0x3f) != 0) {
    uVar11 = 0;
    do {
      iVar2 = pCut->pLeaves[uVar11];
      if (((long)iVar2 < 0) || (pVVar3 = p->pNtk->vObjs, pVVar3->nSize <= iVar2)) {
LAB_004eb642:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (uint *)((long)pVVar3->pArray[iVar2] + 0x14);
      *puVar1 = *puVar1 & 0xffffffef;
      uVar11 = uVar11 + 1;
    } while (uVar11 < (*(uint *)pCut & 0x3f));
  }
  return iVar12;
}

Assistant:

int Lpk_NodeCutsCheckDsd( Lpk_Man_t * p, Lpk_Cut_t * pCut )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nCands, fLeavesOnly, RetValue;
    assert( pCut->nLeaves > 0 );
    // clear ref counters
    memset( p->pRefs, 0, sizeof(int) * pCut->nLeaves );
    // mark cut leaves
    Lpk_CutForEachLeaf( p->pNtk, pCut, pObj, i )
    {
        assert( pObj->fMarkA == 0 );
        pObj->fMarkA = 1;
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)i;
    }
    // ref leaves pointed from the internal nodes
    nCands = 0;
    Lpk_CutForEachNode( p->pNtk, pCut, pObj, i )
    {
        fLeavesOnly = 1;
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( pFanin->fMarkA )
                p->pRefs[(int)(ABC_PTRUINT_T)pFanin->pCopy]++;
            else
                fLeavesOnly = 0;
        if ( fLeavesOnly )
            p->pCands[nCands++] = pObj->Id;
    }
    // look at the nodes that only point to the leaves
    RetValue = 0;
    for ( i = 0; i < nCands; i++ )
    {
        pObj = Abc_NtkObj( p->pNtk, p->pCands[i] );
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            assert( pFanin->fMarkA == 1 );
            if ( p->pRefs[(int)(ABC_PTRUINT_T)pFanin->pCopy] > 1 )
                break;
        }
        if ( k == Abc_ObjFaninNum(pObj) )
        {
            RetValue = 1;
            break;
        }
    }
    // unmark cut leaves
    Lpk_CutForEachLeaf( p->pNtk, pCut, pObj, i )
        pObj->fMarkA = 0;
    return RetValue;
}